

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void register_logging(char *filename,uint32_t *cats,int *level)

{
  bool bVar1;
  int iVar2;
  file_data *pfVar3;
  undefined1 local_50 [16];
  iterator i;
  undefined1 auStack_38 [7];
  bool found;
  file_data node;
  int *level_local;
  uint32_t *cats_local;
  char *filename_local;
  
  node.level = level;
  if (first_register) {
    logging_init();
  }
  node.cats = (uint32_t *)node.level;
  i.mNode._7_1_ = 0;
  _auStack_38 = filename;
  node.filename = (char *)cats;
  JetHead::list<file_data>::begin((list<file_data> *)(local_50 + 8));
  do {
    JetHead::list<file_data>::end((list<file_data> *)local_50);
    bVar1 = JetHead::list<file_data>::iterator::operator!=
                      ((iterator *)(local_50 + 8),(iterator *)local_50);
    JetHead::list<file_data>::iterator::~iterator((iterator *)local_50);
    if (!bVar1) {
LAB_001373a2:
      JetHead::list<file_data>::iterator::~iterator((iterator *)(local_50 + 8));
      if ((i.mNode._7_1_ & 1) == 0) {
        JetHead::list<file_data>::push_back(file_data_list,(file_data *)auStack_38);
      }
      if (jh_log_names_buffer != (char *)0x0) {
        free(jh_log_names_buffer);
        jh_log_names_buffer = (char *)0x0;
      }
      return;
    }
    pfVar3 = JetHead::list<file_data>::iterator::operator->((iterator *)(local_50 + 8));
    iVar2 = strcasecmp(pfVar3->filename,filename);
    if (0 < iVar2) {
      JetHead::list<file_data>::iterator::insertBefore
                ((iterator *)(local_50 + 8),(file_data *)auStack_38);
      i.mNode._7_1_ = 1;
      goto LAB_001373a2;
    }
    JetHead::list<file_data>::iterator::operator++((iterator *)(local_50 + 8));
  } while( true );
}

Assistant:

void register_logging( const char *filename, uint32_t *cats, int *level )
{
	struct file_data node;

	TRACE_BEGIN(LOG_LVL_INFO);

	if ( first_register )
		logging_init();

	node.filename = filename;
	node.cats = cats;
	node.level = level;

	bool found = false;
	for (JetHead::list<file_data>::iterator i = file_data_list->begin(); 
		 i != file_data_list->end(); ++i)
	{
		if ( strcasecmp( i->filename, filename) > 0 )
		{
			i.insertBefore(node);
			found = true;
			break;
		}
	}
	
	if ( not found )
	{
		file_data_list->push_back(node);
	}

	// if we have already built the name buffer then delete it since we just 
	//  changed it.
	if ( jh_log_names_buffer != NULL )
	{
		LOGGING_FREE( jh_log_names_buffer );
		jh_log_names_buffer = NULL;
	}
	
	TRACE_END();
}